

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O0

void MPIU_Segmenter_init(MPIU_Segmenter *segmenter,size_t *sizes,size_t *sizes2,size_t avgsegsize,
                        int Ngroup,MPI_Comm comm)

{
  int iVar1;
  int local_44;
  int local_40;
  int rank;
  int NTask;
  int ThisTask;
  MPI_Comm comm_local;
  size_t sStack_28;
  int Ngroup_local;
  size_t avgsegsize_local;
  size_t *sizes2_local;
  size_t *sizes_local;
  MPIU_Segmenter *segmenter_local;
  
  _NTask = comm;
  comm_local._4_4_ = Ngroup;
  sStack_28 = avgsegsize;
  avgsegsize_local = (size_t)sizes2;
  sizes2_local = sizes;
  sizes_local = (size_t *)segmenter;
  MPI_Comm_size(comm,&local_40);
  MPI_Comm_rank(_NTask,&rank);
  iVar1 = _MPIU_Segmenter_assign_colors
                    (sStack_28,sizes2_local,(size_t *)avgsegsize_local,
                     (int *)((long)sizes_local + 4),_NTask);
  *(int *)((long)sizes_local + 0xc) = iVar1;
  if (*(int *)((long)sizes_local + 0xc) < 0) {
    *(int *)(sizes_local + 1) = comm_local._4_4_ + 1;
    *(int *)((long)sizes_local + 0xc) = local_40 + 1;
  }
  else {
    *(int *)(sizes_local + 1) =
         (int)((ulong)((long)*(int *)((long)sizes_local + 0xc) * (long)comm_local._4_4_) /
              (ulong)(long)*(int *)((long)sizes_local + 4));
  }
  *(int *)sizes_local = comm_local._4_4_;
  MPI_Comm_split(_NTask,(int)sizes_local[1],rank,sizes_local + 6);
  MPI_Allreduce((long)sizes_local + 0xc,sizes_local + 3,1,&ompi_mpi_int,&ompi_mpi_op_min,
                sizes_local[6]);
  MPI_Allreduce((long)sizes_local + 0xc,(long)sizes_local + 0x1c,1,&ompi_mpi_int,&ompi_mpi_op_max,
                sizes_local[6]);
  *(int *)((long)sizes_local + 0x1c) = *(int *)((long)sizes_local + 0x1c) + 1;
  MPI_Comm_rank(sizes_local[6],&local_44);
  iVar1 = MPIU_GetLoc(sizes2_local + rank,(MPI_Datatype)&ompi_mpi_long,(MPI_Op)&ompi_mpi_op_max,
                      (MPI_Comm)sizes_local[6]);
  *(int *)((long)sizes_local + 0x24) = iVar1;
  *(uint *)(sizes_local + 4) = (uint)(local_44 == *(int *)((long)sizes_local + 0x24));
  MPI_Comm_split(_NTask,local_44 != *(int *)((long)sizes_local + 0x24),rank,sizes_local + 7);
  MPI_Comm_split(sizes_local[6],*(undefined4 *)((long)sizes_local + 0xc),rank,sizes_local + 8);
  iVar1 = MPIU_GetLoc(sizes2_local + rank,(MPI_Datatype)&ompi_mpi_long,(MPI_Op)&ompi_mpi_op_min,
                      (MPI_Comm)sizes_local[8]);
  *(int *)(sizes_local + 5) = iVar1;
  return;
}

Assistant:

void
MPIU_Segmenter_init(MPIU_Segmenter * segmenter,
               size_t * sizes,
               size_t * sizes2,
               size_t avgsegsize,
               int Ngroup,
               MPI_Comm comm)
{
    int ThisTask, NTask;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    segmenter->ThisSegment = _MPIU_Segmenter_assign_colors(avgsegsize, sizes, sizes2, &segmenter->Nsegments, comm);

    if(segmenter->ThisSegment >= 0) {
        /* assign segments to groups.
         * if Nsegments < Ngroup, some groups will have no segments, and thus no ranks belong to them. */
        segmenter->GroupID = ((size_t) segmenter->ThisSegment) * Ngroup / segmenter->Nsegments;
    } else {
        segmenter->GroupID = Ngroup + 1;
        segmenter->ThisSegment = NTask + 1;
    }

    segmenter->Ngroup = Ngroup;

    MPI_Comm_split(comm, segmenter->GroupID, ThisTask, &segmenter->Group);

    MPI_Allreduce(&segmenter->ThisSegment, &segmenter->segment_start, 1, MPI_INT, MPI_MIN, segmenter->Group);
    MPI_Allreduce(&segmenter->ThisSegment, &segmenter->segment_end, 1, MPI_INT, MPI_MAX, segmenter->Group);

    segmenter->segment_end ++;

    int rank;

    MPI_Comm_rank(segmenter->Group, &rank);

    /* rank with most data in a group is the leader of the group. */
    segmenter->group_leader_rank = MPIU_GetLoc(&sizes[ThisTask], MPI_LONG, MPI_MAX, segmenter->Group);

    segmenter->is_group_leader = rank == segmenter->group_leader_rank;

    MPI_Comm_split(comm, (rank == segmenter->group_leader_rank)? 0 : 1, ThisTask, &segmenter->Leaders);

    MPI_Comm_split(segmenter->Group, segmenter->ThisSegment, ThisTask, &segmenter->Segment);

    /* rank with least data in a segment is the leader of the segment. */
    segmenter->segment_leader_rank = MPIU_GetLoc(&sizes[ThisTask], MPI_LONG, MPI_MIN, segmenter->Segment);
}